

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_handle.cpp
# Opt level: O3

void __thiscall
duckdb::BlockHandle::BlockHandle
          (BlockHandle *this,BlockManager *block_manager,block_id_t block_id_p,MemoryTag tag)

{
  int iVar1;
  undefined4 extraout_var;
  idx_t iVar2;
  
  (this->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
  super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
  super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->block_manager = block_manager;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->readers).super___atomic_base<int>._M_i = 0;
  this->block_id = block_id_p;
  this->tag = tag;
  this->buffer_type = BLOCK;
  (this->destroy_buffer_upon)._M_i = BLOCK;
  (this->buffer).super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t
  .super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
  super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl = (FileBuffer *)0x0;
  (this->eviction_seq_num).super___atomic_base<unsigned_long>._M_i = 0;
  iVar1 = (*block_manager->buffer_manager->_vptr_BufferManager[0x1f])();
  BufferPoolReservation::BufferPoolReservation
            (&this->memory_charge,tag,(BufferPool *)CONCAT44(extraout_var,iVar1));
  this->unswizzled = (char *)0x0;
  (this->eviction_queue_idx).super___atomic_base<unsigned_long>._M_i = 0xffffffffffffffff;
  LOCK();
  (this->eviction_seq_num).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->state)._M_i = BLOCK_UNLOADED;
  UNLOCK();
  iVar2 = optional_idx::GetIndex(&block_manager->block_alloc_size);
  LOCK();
  (this->memory_usage).super___atomic_base<unsigned_long>._M_i = iVar2;
  UNLOCK();
  return;
}

Assistant:

BlockHandle::BlockHandle(BlockManager &block_manager, block_id_t block_id_p, MemoryTag tag)
    : block_manager(block_manager), readers(0), block_id(block_id_p), tag(tag), buffer_type(FileBufferType::BLOCK),
      buffer(nullptr), eviction_seq_num(0), destroy_buffer_upon(DestroyBufferUpon::BLOCK),
      memory_charge(tag, block_manager.buffer_manager.GetBufferPool()), unswizzled(nullptr),
      eviction_queue_idx(DConstants::INVALID_INDEX) {
	eviction_seq_num = 0;
	state = BlockState::BLOCK_UNLOADED;
	memory_usage = block_manager.GetBlockAllocSize();
}